

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall CommandBlock::~CommandBlock(CommandBlock *this)

{
  Process *this_00;
  CommandBlock *this_local;
  
  (this->super_Block)._vptr_Block = (_func_int **)&PTR__CommandBlock_001fcc40;
  this_00 = this->process;
  if (this_00 != (Process *)0x0) {
    TinyProcessLib::Process::~Process(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->consoleOutput);
  std::__cxx11::string::~string((string *)&this->command);
  Block::~Block(&this->super_Block);
  return;
}

Assistant:

virtual ~CommandBlock()
    {
        delete process;
    }